

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::Country::Country(Country *this,int id,string *name,int continent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int *piVar4;
  string *psVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar6;
  
  piVar4 = (int *)operator_new(4);
  *piVar4 = id;
  this->cyID = piVar4;
  psVar5 = (string *)operator_new(0x20);
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&name->field_2 + 8);
    (psVar5->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&psVar5->field_2 + 8) = uVar3;
  }
  else {
    (psVar5->_M_dataplus)._M_p = pcVar2;
    (psVar5->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  psVar5->_M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this->cyName = psVar5;
  piVar4 = (int *)operator_new(4);
  *piVar4 = continent + -1;
  this->cyContinent = piVar4;
  pvVar6 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar6->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar6->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar6->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pAdjCountries = pvVar6;
  piVar4 = (int *)operator_new(4);
  *piVar4 = -1;
  this->pPlayerOwnerId = piVar4;
  piVar4 = (int *)operator_new(4);
  *piVar4 = 0;
  this->pNumberOfTroops = piVar4;
  return;
}

Assistant:

Map::Country::Country(int id, std::string name, int continent) {
    cyID = new int(id);
    cyName = new std::string(std::move(name));
    // each country only has one continent (-1 because we transform continent count to continent index)
    cyContinent = new int(continent - 1);
    pAdjCountries = new std::vector<Country*>;
    pPlayerOwnerId = new int(-1);
    pNumberOfTroops = new int(0);
}